

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

void sha256_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  long lVar1;
  ptls_hash_context_t *ppVar2;
  SHA256_CTX *pSVar3;
  SHA256_CTX copy;
  
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    ppVar2 = _ctx + 1;
    pSVar3 = &copy;
    for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
      pSVar3->h[0] = *(undefined4 *)&ppVar2->update;
      ppVar2 = (ptls_hash_context_t *)((long)&ppVar2->update + 4);
      pSVar3 = (SHA256_CTX *)((long)pSVar3 + 4);
    }
    SHA256_Final((uchar *)md,(SHA256_CTX *)&copy);
    (*ptls_clear_memory)(&copy,0x70);
    return;
  }
  if (md != (void *)0x0) {
    SHA256_Final((uchar *)md,(SHA256_CTX *)(_ctx + 1));
  }
  if (mode != PTLS_HASH_FINAL_MODE_RESET) {
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)(_ctx + 1,0x70);
      free(_ctx);
      return;
    }
    __assert_fail("!\"FIXME\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/openssl.c"
                  ,0x1fe,"void sha256_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)")
    ;
  }
  SHA256_Init((SHA256_CTX *)(_ctx + 1));
  return;
}

Assistant:

static void sha256_final(ptls_hash_context_t *_ctx, void *md, ptls_hash_final_mode_t mode)
{
    struct sha256_context_t *ctx = (struct sha256_context_t *)_ctx;

    if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
        cf_sha256_context copy = ctx->ctx;
        cf_sha256_digest_final(&copy, md);
        ptls_clear_memory(&copy, sizeof(copy));
        return;
    }

    if (md != NULL)
        cf_sha256_digest_final(&ctx->ctx, md);

    switch (mode) {
    case PTLS_HASH_FINAL_MODE_FREE:
        ptls_clear_memory(&ctx->ctx, sizeof(ctx->ctx));
        free(ctx);
        break;
    case PTLS_HASH_FINAL_MODE_RESET:
        cf_sha256_init(&ctx->ctx);
        break;
    default:
        assert(!"FIXME");
        break;
    }
}